

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O0

int __thiscall
ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  void *__dest;
  void *__src;
  long in_RSI;
  long in_RDI;
  int dst_q;
  int src_q;
  int j;
  int i;
  size_t feature_sz;
  int channels_per_group;
  int _group;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffee0;
  Mat *this_00;
  size_t in_stack_fffffffffffffee8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  Mat *in_stack_ffffffffffffff08;
  Mat local_a8;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  size_t local_50;
  int local_48;
  int local_44;
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x38);
  local_40 = *(long *)(in_RSI + 0x10);
  if (local_34 % *(int *)(in_RDI + 0xd0) == 0) {
    if (*(int *)(in_RDI + 0xd4) == 0) {
      local_44 = *(int *)(in_RDI + 0xd0);
    }
    else {
      local_44 = local_34 / *(int *)(in_RDI + 0xd0);
    }
    local_48 = local_34 / local_44;
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (int)((ulong)in_RDI >> 0x20),(int)in_RDI,local_44,in_stack_fffffffffffffee8,
                      (Allocator *)in_stack_fffffffffffffee0);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffee0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_50 = (long)local_2c * (long)local_30 * local_40;
      for (local_54 = 0; local_54 < local_44; local_54 = local_54 + 1) {
        for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
          local_5c = local_48 * local_54 + local_58;
          local_60 = local_44 * local_58 + local_54;
          this_00 = &local_a8;
          ncnn::Mat::channel(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
          __dest = ncnn::Mat::operator_cast_to_void_(this_00);
          ncnn::Mat::channel(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
          __src = ncnn::Mat::operator_cast_to_void_((Mat *)&stack0xffffffffffffff00);
          memcpy(__dest,__src,local_50);
          ncnn::Mat::~Mat((Mat *)0x6b5d93);
          ncnn::Mat::~Mat((Mat *)0x6b5da0);
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0)
    {
        // reject invalid group
        return -100;
    }

    int _group = reverse ? channels / group : group;
    int channels_per_group = channels / _group;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = (size_t)w * h * elemsize;
    for (int i = 0; i < _group; i++)
    {
        for (int j = 0; j < channels_per_group; j++)
        {
            int src_q = channels_per_group * i + j;
            int dst_q = _group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }

    return 0;
}